

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void deduct_cost(CHAR_DATA *ch,int cost)

{
  long lVar1;
  string_view fmt;
  char *__str;
  long *plVar2;
  int in_ESI;
  long in_RDI;
  long *in_stack_00000010;
  int gold;
  char *in_stack_00000028;
  
  __str = (char *)(long)in_ESI;
  plVar2 = std::min<long>((long *)(in_RDI + 0x168),(long *)&stack0xffffffffffffffe8);
  lVar1 = *plVar2;
  *(long *)(in_RDI + 0x168) = *(long *)(in_RDI + 0x168) - (long)(int)lVar1;
  if (*(long *)(in_RDI + 0x168) < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(in_ESI,(int)lVar1),__str
              );
    fmt._M_str = in_stack_00000028;
    fmt._M_len = (size_t)ch;
    CLogger::Warn<long&>((CLogger *)CONCAT44(cost,gold),fmt,in_stack_00000010);
    *(undefined8 *)(in_RDI + 0x168) = 0;
  }
  return;
}

Assistant:

void deduct_cost(CHAR_DATA *ch, int cost)
{
	int gold = 0;

	gold = std::min(ch->gold, (long)cost);

	ch->gold -= gold;

	if (ch->gold < 0)
	{
		RS.Logger.Warn("deduct costs: gold {} < 0", ch->gold);
		ch->gold = 0;
	}
}